

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

void __thiscall dxil_spv::CFGStructurizer::insert_phi(CFGStructurizer *this)

{
  pointer pPVar1;
  pointer *ppPVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  CFGNode *pCVar5;
  pointer pPVar6;
  iterator __position;
  pointer ppOVar7;
  pointer pPVar8;
  long lVar9;
  uint uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __dest;
  pointer ppCVar13;
  mapped_type *ppCVar14;
  ulong uVar15;
  pointer ppCVar16;
  pointer pPVar17;
  uint uVar18;
  pointer pPVar19;
  PHI *phi;
  pointer __k;
  PHINode *phi_node;
  pointer ppOVar20;
  __normal_iterator<dxil_spv::CFGStructurizer::PHINode_*,_std::vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>_>
  __i;
  pointer pPVar21;
  CFGNode *back_edge;
  PHINode local_58;
  pointer local_48;
  pointer local_40;
  Vector<PHINode> *local_38;
  
  ppCVar13 = (this->forward_post_visit_order).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar3 = (this->forward_post_visit_order).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pCVar5 = local_58.block;
  do {
    if (ppCVar13 == ppCVar3) {
      local_58.block = pCVar5;
      prune_dead_preds(this);
      fixup_broken_value_dominance(this);
      ppCVar13 = (this->forward_post_visit_order).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_48 = (this->forward_post_visit_order).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar13 != local_48) {
        local_38 = &this->phi_nodes;
        do {
          pCVar5 = *ppCVar13;
          __k = (pCVar5->ir).phi.
                super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>.
                _M_impl.super__Vector_impl_data._M_start;
          pPVar6 = (pCVar5->ir).phi.
                   super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_40 = ppCVar13;
          if (__k != pPVar6) {
            uVar18 = 0;
            do {
              __position._M_current =
                   (this->phi_nodes).
                   super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_58.block = pCVar5;
              local_58.phi_index = uVar18;
              if (__position._M_current ==
                  (this->phi_nodes).
                  super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                ::_M_realloc_insert<dxil_spv::CFGStructurizer::PHINode>
                          (local_38,__position,&local_58);
              }
              else {
                (__position._M_current)->block = pCVar5;
                *(ulong *)&(__position._M_current)->phi_index = CONCAT44(local_58._12_4_,uVar18);
                ppPVar2 = &(this->phi_nodes).
                           super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppPVar2 = *ppPVar2 + 1;
              }
              if (__k->id != 0) {
                ppCVar14 = std::__detail::
                           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)&this->value_id_to_block,&__k->id);
                *ppCVar14 = pCVar5;
              }
              uVar18 = uVar18 + 1;
              __k = __k + 1;
            } while (__k != pPVar6);
          }
          ppOVar7 = (pCVar5->ir).operations.
                    super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppOVar20 = (pCVar5->ir).operations.
                          super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppOVar20 != ppOVar7;
              ppOVar20 = ppOVar20 + 1) {
            if ((*ppOVar20)->id != 0) {
              ppCVar14 = std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&this->value_id_to_block,&(*ppOVar20)->id);
              *ppCVar14 = pCVar5;
            }
          }
          ppCVar13 = local_40 + 1;
        } while (ppCVar13 != local_48);
      }
      pPVar17 = (this->phi_nodes).
                super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar8 = (this->phi_nodes).
               super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar17 != pPVar8) {
        uVar15 = (long)pPVar8 - (long)pPVar17 >> 4;
        lVar9 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::CFGStructurizer::PHINode*,std::vector<dxil_spv::CFGStructurizer::PHINode,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::insert_phi()::__0>>
                  (pPVar17,pPVar8,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)pPVar8 - (long)pPVar17 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGStructurizer::PHINode*,std::vector<dxil_spv::CFGStructurizer::PHINode,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::insert_phi()::__0>>
                    (pPVar17,pPVar8);
        }
        else {
          pPVar21 = pPVar17 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGStructurizer::PHINode*,std::vector<dxil_spv::CFGStructurizer::PHINode,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::insert_phi()::__0>>
                    (pPVar17,pPVar21);
          for (; pPVar21 != pPVar8; pPVar21 = pPVar21 + 1) {
            pCVar5 = pPVar21->block;
            uVar18 = pPVar21->phi_index;
            uVar12 = *(undefined4 *)&pPVar21->field_0xc;
            pPVar17 = pPVar21;
            pPVar19 = pPVar21;
            if ((pPVar21[-1].block)->forward_post_visit_order < pCVar5->forward_post_visit_order) {
              do {
                pPVar17 = pPVar19 + -1;
                uVar10 = pPVar19[-1].phi_index;
                uVar11 = *(undefined4 *)&pPVar19[-1].field_0xc;
                pPVar19->block = pPVar19[-1].block;
                pPVar19->phi_index = uVar10;
                *(undefined4 *)&pPVar19->field_0xc = uVar11;
                pPVar1 = pPVar19 + -2;
                pPVar19 = pPVar17;
              } while (pPVar1->block->forward_post_visit_order < pCVar5->forward_post_visit_order);
            }
            pPVar17->block = pCVar5;
            pPVar17->phi_index = uVar18;
            *(undefined4 *)&pPVar17->field_0xc = uVar12;
          }
        }
      }
      pPVar8 = (this->phi_nodes).
               super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pPVar17 = (this->phi_nodes).
                     super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                     ._M_impl.super__Vector_impl_data._M_start; pPVar17 != pPVar8;
          pPVar17 = pPVar17 + 1) {
        fixup_phi(this,pPVar17);
        insert_phi(this,pPVar17);
      }
      return;
    }
    local_58.block = (*ppCVar13)->pred_back_edge;
    if (((local_58.block != (CFGNode *)0x0) && (((local_58.block)->ir).terminator.type == Branch))
       && ((local_58.block)->succ_back_edge == ((local_58.block)->ir).terminator.direct_block)) {
      ppCVar16 = ((local_58.block)->succ).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar4 = ((local_58.block)->succ).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((long)ppCVar4 - (long)ppCVar16 == 8) {
        pCVar5 = *ppCVar16;
        if (ppCVar4 != ppCVar16) {
          ((local_58.block)->succ).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppCVar16;
        }
        __dest = std::
                 __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                           ((pCVar5->pred).
                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (pCVar5->pred).
                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_58);
        ppCVar16 = (pCVar5->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (__dest._M_current == ppCVar16) {
          __assert_fail("itr != succ->pred.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                        ,0x807,"void dxil_spv::CFGStructurizer::insert_phi()");
        }
        ppCVar4 = __dest._M_current + 1;
        if (ppCVar4 != ppCVar16) {
          memmove(__dest._M_current,ppCVar4,(long)ppCVar16 - (long)ppCVar4);
          ppCVar16 = (pCVar5->pred).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        (pCVar5->pred).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppCVar16 + -1;
        CFGNode::recompute_immediate_dominator(pCVar5);
        pCVar5 = local_58.block;
      }
    }
    local_58.block = pCVar5;
    ppCVar13 = ppCVar13 + 1;
    pCVar5 = local_58.block;
  } while( true );
}

Assistant:

void CFGStructurizer::insert_phi()
{
	// If we inserted dummy branches from back-edge to rewrite infinite loops, we must prune these branches
	// now, so we don't end up creating a wrong amount of PHI incoming values.
	// We don't have to recompute the CFG since we don't really care about post-visit orders at this stage.
	for (auto *node : forward_post_visit_order)
	{
		if (node->pred_back_edge && node->pred_back_edge->ir.terminator.type == Terminator::Type::Branch &&
		    node->pred_back_edge->succ_back_edge == node->pred_back_edge->ir.terminator.direct_block &&
		    node->pred_back_edge->succ.size() == 1)
		{
			auto *back_edge = node->pred_back_edge;
			auto *succ = back_edge->succ.front();
			back_edge->succ.clear();
			auto itr = std::find(succ->pred.begin(), succ->pred.end(), back_edge);
			assert(itr != succ->pred.end());
			succ->pred.erase(itr);
			succ->recompute_immediate_dominator();
		}
	}

	prune_dead_preds();

	// It is possible that an SSA value was created in a block, and consumed in another.
	// With CFG rewriting branches, it is possible that dominance relationship no longer holds
	// and we must insert new dummy IDs to resolve this.
	fixup_broken_value_dominance();

	// Build a map of value ID -> creating block.
	// This allows us to detect if a value is consumed in a situation where the declaration does not dominate use.
	// This can happen when introducing ladder blocks or similar.
	for (auto *node : forward_post_visit_order)
	{
		unsigned phi_index = 0;
		for (auto &phi : node->ir.phi)
		{
			phi_nodes.push_back({ node, phi_index });
			if (phi.id)
				value_id_to_block[phi.id] = node;
			phi_index++;
		}

		for (auto *op : node->ir.operations)
			if (op->id)
				value_id_to_block[op->id] = node;
	}

	// Resolve phi-nodes top-down since PHI nodes may depend on other PHI nodes.
	std::sort(phi_nodes.begin(), phi_nodes.end(),
	          [](const PHINode &a, const PHINode &b) { return a.block->forward_post_visit_order > b.block->forward_post_visit_order; });

	for (auto &phi_node : phi_nodes)
	{
		fixup_phi(phi_node);
		insert_phi(phi_node);
	}
}